

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-ecc-impl.c
# Opt level: O1

int ndn_lite_default_ecdsa_verify
              (uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size,
              abstract_ecc_pub_key *abs_key,uint8_t ecdsa_type)

{
  int iVar1;
  int iVar2;
  uint8_t local_68 [8];
  uint8_t raw_sig_temp_buf [64];
  uint32_t local_1c [2];
  uint32_t decoded_raw_signature_size;
  
  iVar1 = -0x17;
  if ((((sig_size < 0x49) && (iVar1 = -0x16, abs_key->key_size < 0x41)) &&
      (iVar1 = -0x1a, ecdsa_type == ' ')) &&
     (iVar1 = ndn_asn1_decode_ecdsa_signature(sig_value,sig_size,local_68,0x40,local_1c), iVar1 == 0
     )) {
    iVar2 = uECC_verify(abs_key->key_value,input_value,local_68);
    iVar1 = -0x1d;
    if (iVar2 != 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
ndn_lite_default_ecdsa_verify(const uint8_t* input_value, uint32_t input_size,
                              const uint8_t* sig_value, uint32_t sig_size,
                              const struct abstract_ecc_pub_key* abs_key, uint8_t ecdsa_type)
{

  if (sig_size > NDN_ASN1_ECDSA_MAX_ENCODED_SIG_SIZE)
    return NDN_SEC_WRONG_SIG_SIZE;
  if (abs_key->key_size > NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE)
    return NDN_SEC_WRONG_KEY_SIZE;
  if (ecdsa_type != NDN_ECDSA_CURVE_SECP256R1)
    return NDN_SEC_UNSUPPORT_CRYPTO_ALGO;

  uint8_t raw_sig_temp_buf[NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE];
  uint32_t decoded_raw_signature_size;
  int ret_val = ndn_asn1_decode_ecdsa_signature(sig_value, sig_size, raw_sig_temp_buf,
                                                NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE,
                                                &decoded_raw_signature_size);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }

  if (uECC_verify(abs_key->key_value, input_value, raw_sig_temp_buf) == 0) {
    return NDN_SEC_FAIL_VERIFY_SIG;
  }
  else
    return NDN_SUCCESS;
}